

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O2

void Curl_resolver_kill(Curl_easy *data)

{
  thread_data *ptVar1;
  
  ptVar1 = (data->state).async.tdata;
  if (((ptVar1 != (thread_data *)0x0) && (ptVar1->thread_hnd != (pthread_t *)0x0)) &&
     (((data->set).field_0x8ca & 0x40) == 0)) {
    thread_wait_resolv(data,(Curl_dns_entry **)0x0,false);
    return;
  }
  destroy_async_data(&(data->state).async);
  return;
}

Assistant:

void Curl_resolver_kill(struct Curl_easy *data)
{
  struct thread_data *td = data->state.async.tdata;

  /* If we are still resolving, we must wait for the threads to fully clean up,
     unfortunately. Otherwise, we can simply cancel to clean up any resolver
     data. */
  if(td && td->thread_hnd != curl_thread_t_null
     && (data->set.quick_exit != 1L))
    (void)thread_wait_resolv(data, NULL, FALSE);
  else
    Curl_resolver_cancel(data);
}